

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O2

unsigned_short __thiscall
libdivide::divider<unsigned_short,_(libdivide::Branching)0>::recover
          (divider<unsigned_short,_(libdivide::Branching)0> *this)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  
  bVar1 = (this->div).denom.more;
  uVar2 = (this->div).denom.magic;
  uVar3 = bVar1 & 0x1f;
  if (uVar2 == 0) {
    return (unsigned_short)(1 << uVar3);
  }
  if ((bVar1 & 0x40) == 0) {
    return (short)((uint)(0x10000 << uVar3) / (uint)uVar2) + 1;
  }
  uVar3 = 1 << ((byte)((char)uVar3 + 0x10) & 0x1f);
  uVar4 = uVar2 | 0x10000;
  return (uVar4 <= (uVar3 % uVar4) * 2) + 1 + (short)(uVar3 / uVar4) * 2;
}

Assistant:

T recover() const { return div.recover(); }